

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<char,char>&,char_const(&)[19],kj::StringPtr_const&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<char,_char> *params,char (*params_1) [19],StringPtr *params_2)

{
  long lVar1;
  undefined8 uVar2;
  ArrayPtr<const_char> *params_00;
  ArrayPtr<const_char> *params_01;
  long lVar3;
  String argValues [3];
  char **ppcVar4;
  undefined8 uVar5;
  undefined1 local_be;
  _ local_bd;
  Type local_bc;
  char *local_b8;
  char *local_b0;
  char **local_a8;
  undefined8 uStack_a0;
  char *local_98;
  size_t local_90;
  ArrayDisposer *pAStack_88;
  String local_80;
  String local_68;
  String local_48;
  
  this->exception = (Exception *)0x0;
  local_bd = (_)params->left;
  local_be = params->right;
  local_bc = code;
  local_b8 = condition;
  local_b0 = macroArgs;
  concat<kj::FixedArray<char,1ul>,kj::StringPtr&,kj::FixedArray<char,1ul>>
            (&local_48,&local_bd,(FixedArray<char,_1UL> *)&params->op,(StringPtr *)&local_be,
             (FixedArray<char,_1UL> *)condition);
  local_98 = local_48.content.ptr;
  local_90 = local_48.content.size_;
  pAStack_88 = local_48.content.disposer;
  local_48.content.size_ = strlen(*params_1);
  local_48.content.ptr = *params_1;
  concat<kj::ArrayPtr<char_const>>(&local_80,(_ *)&local_48,params_00);
  local_48.content.ptr = (params_2->content).ptr;
  local_48.content.size_ = (params_2->content).size_ - 1;
  concat<kj::ArrayPtr<char_const>>(&local_68,(_ *)&local_48,params_01);
  ppcVar4 = &local_98;
  uStack_a0 = 3;
  uVar5 = 3;
  local_a8 = ppcVar4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar3 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_98 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_90 + lVar3);
      *(undefined8 *)((long)&local_98 + lVar3) = 0;
      *(undefined8 *)((long)&local_90 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_88 + lVar3))
                (*(undefined8 **)((long)&pAStack_88 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}